

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcodes_Grp3.c
# Opt level: O0

void G3_Ev(PDISASM pMyDisasm)

{
  int iVar1;
  PDISASM pMyDisasm_local;
  
  iVar1 = Security(2,pMyDisasm);
  if (iVar1 != 0) {
    (pMyDisasm->Reserved_).REGOPCODE = *(byte *)((pMyDisasm->Reserved_).EIP_ + 1) >> 3 & 7;
    switch((pMyDisasm->Reserved_).REGOPCODE) {
    case 0:
      (pMyDisasm->Instruction).Category = 0x10005;
      strcpy((pMyDisasm->Instruction).Mnemonic,"test");
      EvIv(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 1;
      FillFlags(pMyDisasm,0x68);
      break;
    case 1:
      (pMyDisasm->Instruction).Category = 0x10005;
      strcpy((pMyDisasm->Instruction).Mnemonic,"test");
      EvIv(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 1;
      FillFlags(pMyDisasm,0x68);
      break;
    case 2:
      if ((pMyDisasm->Prefix).LockPrefix == '\x04') {
        (pMyDisasm->Prefix).LockPrefix = '\x01';
      }
      (pMyDisasm->Instruction).Category = 0x10003;
      strcpy((pMyDisasm->Instruction).Mnemonic,"not");
      Ev(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      FillFlags(pMyDisasm,0x49);
      break;
    case 3:
      (pMyDisasm->Instruction).Category = 0x10002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"neg");
      Ev(pMyDisasm);
      (pMyDisasm->Operand1).AccessMode = 3;
      FillFlags(pMyDisasm,0x47);
      break;
    case 4:
      (pMyDisasm->Instruction).Category = 0x10002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"mul");
      if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        (pMyDisasm->Operand1).OpSize = 0x40;
      }
      else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        (pMyDisasm->Operand1).OpSize = 0x20;
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 0x66;
        (pMyDisasm->Operand1).OpSize = 0x10;
      }
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 1;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
      FillFlags(pMyDisasm,0x46);
      break;
    case 5:
      (pMyDisasm->Instruction).Category = 0x10002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"imul");
      if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        (pMyDisasm->Operand1).OpSize = 0x40;
      }
      else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        (pMyDisasm->Operand1).OpSize = 0x20;
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 0x66;
        (pMyDisasm->Operand1).OpSize = 0x10;
      }
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 1;
      (pMyDisasm->Operand1).AccessMode = 3;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
      FillFlags(pMyDisasm,0x26);
      break;
    case 6:
      (pMyDisasm->Instruction).Category = 0x10002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"div");
      if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        (pMyDisasm->Operand1).OpSize = 0x40;
      }
      else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        (pMyDisasm->Operand1).OpSize = 0x20;
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 0x66;
        (pMyDisasm->Operand1).OpSize = 0x10;
      }
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 5;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
      FillFlags(pMyDisasm,0x1f);
      break;
    case 7:
      (pMyDisasm->Instruction).Category = 0x10002;
      strcpy((pMyDisasm->Instruction).Mnemonic,"idiv");
      if ((pMyDisasm->Reserved_).OperandSize == 0x40) {
        (pMyDisasm->Reserved_).MemDecoration = 0x68;
        (pMyDisasm->Operand1).OpSize = 0x40;
      }
      else if ((pMyDisasm->Reserved_).OperandSize == 0x20) {
        (pMyDisasm->Reserved_).MemDecoration = 0x67;
        (pMyDisasm->Operand1).OpSize = 0x20;
      }
      else {
        (pMyDisasm->Reserved_).MemDecoration = 0x66;
        (pMyDisasm->Operand1).OpSize = 0x10;
      }
      decodeModrm(&pMyDisasm->Operand2,pMyDisasm);
      (pMyDisasm->Reserved_).EIP_ =
           (ulong)((pMyDisasm->Reserved_).DECALAGE_EIP + 2) + (pMyDisasm->Reserved_).EIP_;
      (pMyDisasm->Operand1).OpType = 0x20000;
      (pMyDisasm->Operand1).Registers.type = 1;
      (pMyDisasm->Operand1).Registers.gpr = 5;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.type = 1;
      (pMyDisasm->Instruction).ImplicitModifiedRegs.gpr = 5;
      FillFlags(pMyDisasm,0x25);
    }
  }
  return;
}

Assistant:

void __bea_callspec__ G3_Ev(PDISASM pMyDisasm)
{
    if (!Security(2, pMyDisasm)) return;
    GV.REGOPCODE = ((*((UInt8*) (GV.EIP_+1))) >> 3) & 0x7;
    switch (GV.REGOPCODE) {
      case 0:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "test");
        #endif
        EvIv(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ;
        FillFlags(pMyDisasm, 104);
      break;
      case 1:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+BIT_UInt8;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "test");
        #endif
        EvIv(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ;
        FillFlags(pMyDisasm, 104);
      break;
      case 2:
        if (pMyDisasm->Prefix.LockPrefix == InvalidPrefix) {
            pMyDisasm->Prefix.LockPrefix = InUsePrefix;
        }
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+LOGICAL_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "not");
        #endif
        Ev(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
        FillFlags(pMyDisasm, 73);
      break;
      case 3:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "neg");
        #endif
        Ev(pMyDisasm);
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
        FillFlags(pMyDisasm, 71);
      break;
      case 4:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "mul");
        #endif
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            pMyDisasm->Operand1.OpSize = 64;
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            pMyDisasm->Operand1.OpSize = 32;
        }
        else {
            GV.MemDecoration = Arg2word;
            pMyDisasm->Operand1.OpSize = 16;
        }
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0+REG2;
        FillFlags(pMyDisasm, 70);
      break;
      case 5:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "imul");
        #endif
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            pMyDisasm->Operand1.OpSize = 64;
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            pMyDisasm->Operand1.OpSize = 32;
        }
        else {
            GV.MemDecoration = Arg2word;
            pMyDisasm->Operand1.OpSize = 16;
        }
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;
        pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0;
        pMyDisasm->Operand1.AccessMode = READ + WRITE;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0+REG2;
        FillFlags(pMyDisasm, 38);
      break;
      case 6:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "div");
        #endif
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            pMyDisasm->Operand1.OpSize = 64;
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            pMyDisasm->Operand1.OpSize = 32;
        }
        else {
            GV.MemDecoration = Arg2word;
            pMyDisasm->Operand1.OpSize = 16;
        }
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0+REG2;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0+REG2;
        FillFlags(pMyDisasm, 31);
      break;
      case 7:
        pMyDisasm->Instruction.Category = GENERAL_PURPOSE_INSTRUCTION+ARITHMETIC_INSTRUCTION;
        #ifndef BEA_LIGHT_DISASSEMBLY
           (void) strcpy (pMyDisasm->Instruction.Mnemonic, "idiv");
        #endif
        if (GV.OperandSize == 64) {
            GV.MemDecoration = Arg2qword;
            pMyDisasm->Operand1.OpSize = 64;
        }
        else if (GV.OperandSize == 32) {
            GV.MemDecoration = Arg2dword;
            pMyDisasm->Operand1.OpSize = 32;
        }
        else {
            GV.MemDecoration = Arg2word;
            pMyDisasm->Operand1.OpSize = 16;
        }
        decodeModrm(&pMyDisasm->Operand2, pMyDisasm);
        GV.EIP_ += GV.DECALAGE_EIP+2;
        pMyDisasm->Operand1.OpType = REGISTER_TYPE;pMyDisasm->Operand1.Registers.type = GENERAL_REG;
        pMyDisasm->Operand1.Registers.gpr = REG0+REG2;
        pMyDisasm->Instruction.ImplicitModifiedRegs.type = GENERAL_REG;
        pMyDisasm->Instruction.ImplicitModifiedRegs.gpr = REG0+REG2;
        FillFlags(pMyDisasm, 37);
      }
}